

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

bool baryonyx::itm::stop_iterating<baryonyx::itm::minimize_tag,float>
               (float value,random_engine *rng)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  
  bVar2 = value == 0.0;
  bVar1 = value < 0.0;
  if ((bVar2) && (!NAN(value))) {
    dVar3 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (rng);
    bVar2 = dVar3 == 0.5;
    bVar1 = 0.5 < dVar3;
  }
  return !bVar1 && !bVar2;
}

Assistant:

inline bool
stop_iterating(Float value, random_engine& rng) noexcept
{
    if (value == 0) {
        std::bernoulli_distribution d(0.5);
        return d(rng);
    }

    if constexpr (std::is_same_v<Mode, minimize_tag>)
        return value > 0;
    else
        return value < 0;
}